

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationStart
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  size_type sVar1;
  reference ppTVar2;
  ulong local_28;
  size_t i;
  int iteration_local;
  UnitTest *unit_test_local;
  TestEventRepeater *this_local;
  
  if ((this->forwarding_enabled_ & 1U) != 0) {
    for (local_28 = 0;
        sVar1 = std::
                vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ::size(&this->listeners_), local_28 < sVar1; local_28 = local_28 + 1) {
      ppTVar2 = std::
                vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ::operator[](&this->listeners_,local_28);
      (*(*ppTVar2)->_vptr_TestEventListener[3])(*ppTVar2,unit_test,(ulong)(uint)iteration);
    }
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationStart(const UnitTest& unit_test,
                                             int iteration) {
  if (forwarding_enabled_) {
    for (size_t i = 0; i < listeners_.size(); i++) {
      listeners_[i]->OnTestIterationStart(unit_test, iteration);
    }
  }
}